

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O2

void handle_2misc_narrow(DisasContext_conflict1 *s,_Bool scalar,int opcode,_Bool u,_Bool is_q,
                        int size,int rn,int rd)

{
  TCGContext_conflict1 *tcg_ctx;
  TCGv_i64 tcg_dest;
  TCGv_i32 pTVar1;
  NeonGenNarrowEnvFn **ppNVar2;
  TCGv_i32 lo;
  TCGv_i32 hi;
  TCGv_ptr arg2;
  TCGv_i32 arg3;
  MemOp memop;
  uintptr_t o_1;
  uintptr_t o_5;
  undefined7 in_register_00000031;
  uintptr_t o_4;
  long lVar3;
  uintptr_t o;
  long lStack_c0;
  TCGv_i32 tcg_res [2];
  TCGTemp *local_48;
  TCGv_ptr local_40;
  
  tcg_ctx = s->uc->tcg_ctx;
  if ((int)CONCAT71(in_register_00000031,scalar) == 0) {
    lStack_c0 = 2;
  }
  else {
    tcg_res[1] = tcg_const_i32_aarch64(tcg_ctx,0);
    lStack_c0 = 1;
  }
  memop = MO_64;
  if (scalar) {
    memop = size + MO_16;
  }
  lVar3 = 0;
  do {
    if (lStack_c0 == lVar3) {
      for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
        pTVar1 = tcg_res[lVar3];
        write_vec_element_i32(s,pTVar1,rd,(uint)is_q * 2 + (int)lVar3,MO_32);
        tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
      }
      clear_vec_high(s,is_q,rd);
      return;
    }
    tcg_dest = tcg_temp_new_i64(tcg_ctx);
    read_vec_element(s,tcg_dest,rn,(int)lVar3,memop);
    pTVar1 = tcg_temp_new_i32(tcg_ctx);
    tcg_res[lVar3] = pTVar1;
    if (opcode == 0x56) {
      if (size != 2) {
        __assert_fail("size == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                      ,0x276a,
                      "void handle_2misc_narrow(DisasContext *, _Bool, int, _Bool, _Bool, int, int, int)"
                     );
      }
      local_40 = tcg_ctx->cpu_env + (long)tcg_ctx;
      local_48 = (TCGTemp *)(tcg_dest + (long)&tcg_ctx->pool_cur);
      tcg_gen_callN_aarch64
                (tcg_ctx,helper_fcvtx_f64_to_f32_aarch64,(TCGTemp *)(pTVar1 + (long)tcg_ctx),2,
                 &local_48);
    }
    else {
      ppNVar2 = handle_2misc_narrow::fns[(uint)size] + u;
      if (opcode == 0x14) {
LAB_0063f0a9:
        if (*ppNVar2 != (NeonGenNarrowEnvFn *)0x0) {
          (**ppNVar2)(tcg_ctx,pTVar1,tcg_ctx->cpu_env,tcg_dest);
        }
      }
      else if (opcode == 0x16) {
        if (size == 2) {
          gen_helper_vfp_fcvtsd(tcg_ctx,pTVar1,tcg_dest,tcg_ctx->cpu_env);
        }
        else {
          lo = tcg_temp_new_i32(tcg_ctx);
          hi = tcg_temp_new_i32(tcg_ctx);
          arg2 = get_fpstatus_ptr_aarch64(tcg_ctx,false);
          arg3 = get_ahp_flag(tcg_ctx);
          tcg_gen_extr_i64_i32_aarch64(tcg_ctx,lo,hi,tcg_dest);
          gen_helper_vfp_fcvt_f32_to_f16(tcg_ctx,lo,lo,arg2,arg3);
          gen_helper_vfp_fcvt_f32_to_f16(tcg_ctx,hi,hi,arg2,arg3);
          tcg_gen_deposit_i32_aarch64(tcg_ctx,pTVar1,lo,hi,0x10,0x10);
          tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(lo + (long)tcg_ctx));
          tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(hi + (long)tcg_ctx));
          tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(arg2 + (long)tcg_ctx));
          tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(arg3 + (long)tcg_ctx));
        }
      }
      else {
        if (opcode != 0x12) {
          g_assertion_message_expr
                    ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                     ,0x276e,(char *)0x0);
        }
        ppNVar2 = handle_2misc_narrow::sqxtunfns + (uint)size;
        if (u) goto LAB_0063f0a9;
        (*handle_2misc_narrow::xtnfns[(uint)size])(tcg_ctx,pTVar1,tcg_dest);
      }
    }
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(tcg_dest + (long)tcg_ctx));
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

static void handle_2misc_narrow(DisasContext *s, bool scalar,
                                int opcode, bool u, bool is_q,
                                int size, int rn, int rd)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    /* Handle 2-reg-misc ops which are narrowing (so each 2*size element
     * in the source becomes a size element in the destination).
     */
    int pass;
    TCGv_i32 tcg_res[2];
    int destelt = is_q ? 2 : 0;
    int passes = scalar ? 1 : 2;

    if (scalar) {
        tcg_res[1] = tcg_const_i32(tcg_ctx, 0);
    }

    for (pass = 0; pass < passes; pass++) {
        TCGv_i64 tcg_op = tcg_temp_new_i64(tcg_ctx);
        NeonGenNarrowFn *genfn = NULL;
        NeonGenNarrowEnvFn *genenvfn = NULL;

        if (scalar) {
            read_vec_element(s, tcg_op, rn, pass, size + 1);
        } else {
            read_vec_element(s, tcg_op, rn, pass, MO_64);
        }
        tcg_res[pass] = tcg_temp_new_i32(tcg_ctx);

        switch (opcode) {
        case 0x12: /* XTN, SQXTUN */
        {
            static NeonGenNarrowFn * const xtnfns[3] = {
                gen_helper_neon_narrow_u8,
                gen_helper_neon_narrow_u16,
                tcg_gen_extrl_i64_i32,
            };
            static NeonGenNarrowEnvFn * const sqxtunfns[3] = {
                gen_helper_neon_unarrow_sat8,
                gen_helper_neon_unarrow_sat16,
                gen_helper_neon_unarrow_sat32,
            };
            if (u) {
                genenvfn = sqxtunfns[size];
            } else {
                genfn = xtnfns[size];
            }
            break;
        }
        case 0x14: /* SQXTN, UQXTN */
        {
            static NeonGenNarrowEnvFn * const fns[3][2] = {
                { gen_helper_neon_narrow_sat_s8,
                  gen_helper_neon_narrow_sat_u8 },
                { gen_helper_neon_narrow_sat_s16,
                  gen_helper_neon_narrow_sat_u16 },
                { gen_helper_neon_narrow_sat_s32,
                  gen_helper_neon_narrow_sat_u32 },
            };
            genenvfn = fns[size][u];
            break;
        }
        case 0x16: /* FCVTN, FCVTN2 */
            /* 32 bit to 16 bit or 64 bit to 32 bit float conversion */
            if (size == 2) {
                gen_helper_vfp_fcvtsd(tcg_ctx, tcg_res[pass], tcg_op, tcg_ctx->cpu_env);
            } else {
                TCGv_i32 tcg_lo = tcg_temp_new_i32(tcg_ctx);
                TCGv_i32 tcg_hi = tcg_temp_new_i32(tcg_ctx);
                TCGv_ptr fpst = get_fpstatus_ptr(tcg_ctx, false);
                TCGv_i32 ahp = get_ahp_flag(tcg_ctx);

                tcg_gen_extr_i64_i32(tcg_ctx, tcg_lo, tcg_hi, tcg_op);
                gen_helper_vfp_fcvt_f32_to_f16(tcg_ctx, tcg_lo, tcg_lo, fpst, ahp);
                gen_helper_vfp_fcvt_f32_to_f16(tcg_ctx, tcg_hi, tcg_hi, fpst, ahp);
                tcg_gen_deposit_i32(tcg_ctx, tcg_res[pass], tcg_lo, tcg_hi, 16, 16);
                tcg_temp_free_i32(tcg_ctx, tcg_lo);
                tcg_temp_free_i32(tcg_ctx, tcg_hi);
                tcg_temp_free_ptr(tcg_ctx, fpst);
                tcg_temp_free_i32(tcg_ctx, ahp);
            }
            break;
        case 0x56:  /* FCVTXN, FCVTXN2 */
            /* 64 bit to 32 bit float conversion
             * with von Neumann rounding (round to odd)
             */
            assert(size == 2);
            gen_helper_fcvtx_f64_to_f32(tcg_ctx, tcg_res[pass], tcg_op, tcg_ctx->cpu_env);
            break;
        default:
            g_assert_not_reached();
        }

        if (genfn) {
            genfn(tcg_ctx, tcg_res[pass], tcg_op);
        } else if (genenvfn) {
            genenvfn(tcg_ctx, tcg_res[pass], tcg_ctx->cpu_env, tcg_op);
        }

        tcg_temp_free_i64(tcg_ctx, tcg_op);
    }

    for (pass = 0; pass < 2; pass++) {
        write_vec_element_i32(s, tcg_res[pass], rd, destelt + pass, MO_32);
        tcg_temp_free_i32(tcg_ctx, tcg_res[pass]);
    }
    clear_vec_high(s, is_q, rd);
}